

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)47>,jsonip::parser::char_<(char)47>,jsonip::parser::apply_until_<jsonip::parser::notchar_<(char)10>,jsonip::parser::new_line>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  char *pcVar2;
  iterator iVar3;
  Reader *pRVar4;
  PositionType pcVar5;
  bool bVar6;
  pointer pSVar7;
  PositionType p;
  char *pcVar8;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar3._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar3,(State *)auStack_20);
  }
  else {
    (iVar3._M_current)->pos_ = (PositionType)auStack_20;
    (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar4 = state->reader_;
  pcVar8 = pRVar4->pos_;
  if (((long)pcVar8 - (long)pRVar4->buf_ != pRVar4->len_) && (*pcVar8 == '/')) {
    pcVar2 = pcVar8 + 1;
    pRVar4->pos_ = pcVar2;
    if (((long)pcVar2 - (long)pRVar4->buf_ != pRVar4->len_) && (*pcVar2 == '/')) {
      pRVar4->pos_ = pcVar8 + 2;
      auStack_20 = (undefined1  [8])pRVar4->pos_;
      cur_state.pos_ = (PositionType)state->line_;
      iVar3._M_current =
           (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (state->stack_).
          super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
        ::
        _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                  ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                    *)&state->stack_,iVar3,(State *)auStack_20);
      }
      else {
        (iVar3._M_current)->pos_ = (PositionType)auStack_20;
        (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
        ppSVar1 = &(state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pRVar4 = state->reader_;
      pcVar8 = pRVar4->pos_;
      while( true ) {
        if (((long)pcVar8 - (long)pRVar4->buf_ == pRVar4->len_) || (*pcVar8 != '\n')) {
          bVar6 = false;
        }
        else {
          pcVar8 = pcVar8 + 1;
          pRVar4->pos_ = pcVar8;
          bVar6 = true;
        }
        if (bVar6 != false) {
          state->line_ = state->line_ + 1;
          if (state->max_pos_ < pRVar4->pos_) {
            state->max_pos_ = pRVar4->pos_;
          }
          pSVar7 = (state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00115387;
        }
        if (((long)pcVar8 - (long)pRVar4->buf_ == pRVar4->len_) || (*pcVar8 == '\n')) break;
        pcVar8 = pcVar8 + 1;
        pRVar4->pos_ = pcVar8;
      }
      if (state->max_pos_ < pRVar4->pos_) {
        state->max_pos_ = pRVar4->pos_;
      }
      pRVar4->pos_ = (state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      state->line_ = pSVar7[-1].line_;
LAB_00115387:
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
      goto LAB_001152a0;
    }
  }
  bVar6 = false;
LAB_001152a0:
  pcVar5 = state->reader_->pos_;
  if (bVar6 == false) {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    state->reader_->pos_ =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar7 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar7[-1].line_;
  }
  else {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    pSVar7 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
  return bVar6;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }